

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

int run_test_tcp_open_connected(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uint uVar3;
  uv_timer_t *puVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  ulong unaff_RBX;
  code *__addr;
  uv_shutdown_t *puVar5;
  uv_write_t *puVar6;
  uv_connect_t *puVar7;
  uv_tcp_t *puVar8;
  uv_stream_t *puVar9;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_tcp_t client;
  undefined1 auStack_178 [16];
  code *pcStack_168;
  undefined1 auStack_160 [16];
  code *pcStack_150;
  code *pcStack_148;
  code *pcStack_140;
  code *pcStack_138;
  code *pcStack_130;
  undefined1 local_120 [16];
  sockaddr local_110;
  uv_write_t local_100;
  
  pcStack_130 = (code *)0x17343f;
  local_120 = uv_buf_init("PING",4);
  puVar5 = (uv_shutdown_t *)0x194b4a;
  __addr = (code *)0x23a3;
  pcStack_130 = (code *)0x17345f;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_110);
  if (iVar1 == 0) {
    pcStack_130 = (code *)0x17346c;
    uVar2 = create_tcp_socket();
    unaff_RBX = (ulong)uVar2;
    __addr = (code *)&local_110;
    puVar5 = (uv_shutdown_t *)(ulong)uVar2;
    pcStack_130 = (code *)0x17347f;
    iVar1 = connect(uVar2,(sockaddr *)__addr,0x10);
    if (iVar1 != 0) goto LAB_0017358d;
    pcStack_130 = (code *)0x17348c;
    puVar5 = (uv_shutdown_t *)uv_default_loop();
    __addr = (code *)(&local_110 + 1);
    pcStack_130 = (code *)0x173499;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00173592;
    puVar5 = (uv_shutdown_t *)(&local_110 + 1);
    __addr = (code *)(ulong)uVar2;
    pcStack_130 = (code *)0x1734ad;
    iVar1 = uv_tcp_open();
    if (iVar1 != 0) goto LAB_00173597;
    puVar6 = &write_req;
    __addr = (code *)(&local_110 + 1);
    pcStack_130 = (code *)0x1734d7;
    iVar1 = uv_write(&write_req,__addr,local_120,1,write_cb);
    puVar5 = (uv_shutdown_t *)puVar6;
    if (iVar1 != 0) goto LAB_0017359c;
    puVar5 = &shutdown_req;
    __addr = (code *)(&local_110 + 1);
    pcStack_130 = (code *)0x1734f7;
    iVar1 = uv_shutdown(&shutdown_req,__addr,shutdown_cb);
    if (iVar1 != 0) goto LAB_001735a1;
    __addr = alloc_cb;
    puVar5 = (uv_shutdown_t *)(&local_110 + 1);
    pcStack_130 = (code *)0x173517;
    iVar1 = uv_read_start(puVar5,alloc_cb,read_cb);
    if (iVar1 != 0) goto LAB_001735a6;
    pcStack_130 = (code *)0x173524;
    puVar5 = (uv_shutdown_t *)uv_default_loop();
    __addr = (code *)0x0;
    pcStack_130 = (code *)0x17352e;
    uv_run();
    if (shutdown_cb_called != 1) goto LAB_001735ab;
    if (write_cb_called != 1) goto LAB_001735b0;
    if (close_cb_called != 1) goto LAB_001735b5;
    pcStack_130 = (code *)0x17354e;
    unaff_RBX = uv_default_loop();
    pcStack_130 = (code *)0x173562;
    uv_walk(unaff_RBX,close_walk_cb,0);
    __addr = (code *)0x0;
    pcStack_130 = (code *)0x17356c;
    uv_run(unaff_RBX);
    pcStack_130 = (code *)0x173571;
    puVar5 = (uv_shutdown_t *)uv_default_loop();
    pcStack_130 = (code *)0x173579;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_130 = (code *)0x17358d;
    run_test_tcp_open_connected_cold_1();
LAB_0017358d:
    pcStack_130 = (code *)0x173592;
    run_test_tcp_open_connected_cold_2();
LAB_00173592:
    pcStack_130 = (code *)0x173597;
    run_test_tcp_open_connected_cold_3();
LAB_00173597:
    pcStack_130 = (code *)0x17359c;
    run_test_tcp_open_connected_cold_4();
LAB_0017359c:
    pcStack_130 = (code *)0x1735a1;
    run_test_tcp_open_connected_cold_5();
LAB_001735a1:
    pcStack_130 = (code *)0x1735a6;
    run_test_tcp_open_connected_cold_6();
LAB_001735a6:
    pcStack_130 = (code *)0x1735ab;
    run_test_tcp_open_connected_cold_7();
LAB_001735ab:
    pcStack_130 = (code *)0x1735b0;
    run_test_tcp_open_connected_cold_8();
LAB_001735b0:
    pcStack_130 = (code *)0x1735b5;
    run_test_tcp_open_connected_cold_9();
LAB_001735b5:
    pcStack_130 = (code *)0x1735ba;
    run_test_tcp_open_connected_cold_10();
  }
  pcStack_130 = write_cb;
  run_test_tcp_open_connected_cold_11();
  if ((uv_write_t *)puVar5 == (uv_write_t *)0x0) {
    pcStack_138 = (code *)0x1735d6;
    write_cb_cold_2();
  }
  else if ((int)__addr == 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  puVar5 = (uv_shutdown_t *)((ulong)__addr & 0xffffffff);
  pcStack_138 = shutdown_cb;
  write_cb_cold_1();
  if (puVar5 == &shutdown_req) {
    if ((int)__addr == 0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    pcStack_140 = (code *)0x1735fb;
    shutdown_cb_cold_1();
  }
  pcStack_140 = alloc_cb;
  shutdown_cb_cold_2();
  if (__addr < (sockaddr *)0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x31ec70;
  }
  pcStack_148 = read_cb;
  alloc_cb_cold_1();
  if (puVar5 == (uv_shutdown_t *)0x0) {
    pcStack_150 = (code *)0x17365b;
    read_cb_cold_4();
LAB_0017365b:
    pcStack_150 = (code *)0x173660;
    read_cb_cold_2();
LAB_00173660:
    pcStack_150 = (code *)0x173665;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)__addr) {
      if ((sockaddr *)__addr != (sockaddr *)0x4) goto LAB_0017365b;
      if (*(int *)*extraout_RDX_00 == 0x474e4950) {
        return extraout_EAX_01;
      }
      goto LAB_00173660;
    }
    if ((sockaddr *)__addr == (sockaddr *)0xfffffffffffff001) {
      iVar1 = uv_close();
      return iVar1;
    }
  }
  pcStack_150 = run_test_tcp_write_ready;
  read_cb_cold_1();
  puVar7 = (uv_connect_t *)0x194b4a;
  uVar2 = 0x23a3;
  pcStack_168 = (code *)0x173683;
  pcStack_150 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_160);
  if (iVar1 == 0) {
    pcStack_168 = (code *)0x173690;
    uVar3 = create_tcp_socket();
    unaff_RBX = (ulong)uVar3;
    pcStack_168 = (code *)0x173697;
    puVar7 = (uv_connect_t *)uv_default_loop();
    uVar2 = 0x31e9f0;
    pcStack_168 = (code *)0x1736a6;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00173766;
    puVar8 = &::client;
    pcStack_168 = (code *)0x1736bc;
    iVar1 = uv_tcp_open();
    puVar7 = (uv_connect_t *)puVar8;
    if (iVar1 != 0) goto LAB_0017376b;
    puVar7 = &connect_req;
    uVar3 = 0x31e9f0;
    pcStack_168 = (code *)0x1736e1;
    iVar1 = uv_tcp_connect(&connect_req,&::client,auStack_160,connect1_cb);
    if (iVar1 != 0) goto LAB_00173770;
    pcStack_168 = (code *)0x1736ee;
    puVar7 = (uv_connect_t *)uv_default_loop();
    uVar3 = 0;
    pcStack_168 = (code *)0x1736f8;
    uv_run();
    if (shutdown_cb_called != 1) goto LAB_00173775;
    if (shutdown_requested != 1) goto LAB_0017377a;
    if (connect_cb_called != 1) goto LAB_0017377f;
    if (write_cb_called < 1) goto LAB_00173784;
    if (close_cb_called != 1) goto LAB_00173789;
    pcStack_168 = (code *)0x17372a;
    unaff_RBX = uv_default_loop();
    pcStack_168 = (code *)0x17373e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    uVar3 = 0;
    pcStack_168 = (code *)0x173748;
    uv_run(unaff_RBX);
    pcStack_168 = (code *)0x17374d;
    puVar7 = (uv_connect_t *)uv_default_loop();
    pcStack_168 = (code *)0x173755;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_168 = (code *)0x173766;
    run_test_tcp_write_ready_cold_1();
LAB_00173766:
    uVar3 = uVar2;
    pcStack_168 = (code *)0x17376b;
    run_test_tcp_write_ready_cold_2();
LAB_0017376b:
    pcStack_168 = (code *)0x173770;
    run_test_tcp_write_ready_cold_3();
LAB_00173770:
    pcStack_168 = (code *)0x173775;
    run_test_tcp_write_ready_cold_4();
LAB_00173775:
    pcStack_168 = (code *)0x17377a;
    run_test_tcp_write_ready_cold_5();
LAB_0017377a:
    pcStack_168 = (code *)0x17377f;
    run_test_tcp_write_ready_cold_6();
LAB_0017377f:
    pcStack_168 = (code *)0x173784;
    run_test_tcp_write_ready_cold_7();
LAB_00173784:
    pcStack_168 = (code *)0x173789;
    run_test_tcp_write_ready_cold_8();
LAB_00173789:
    pcStack_168 = (code *)0x17378e;
    run_test_tcp_write_ready_cold_9();
  }
  pcStack_168 = connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar9 = connect_req.handle;
  pcStack_168 = (code *)unaff_RBX;
  if (puVar7 == &connect_req) {
    puVar4 = (uv_timer_t *)puVar7;
    if (uVar3 != 0) goto LAB_00173859;
    connect_cb_called = connect_cb_called + 1;
    puVar4 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init(puVar4,&tm);
    if (iVar1 != 0) goto LAB_0017385e;
    puVar4 = &tm;
    iVar1 = uv_timer_start(&tm,timer_cb,2000,0);
    if (iVar1 != 0) goto LAB_00173863;
    auStack_178 = uv_buf_init("P",1);
    puVar6 = &write_req;
    iVar1 = uv_write(&write_req,puVar9,auStack_178,1,write1_cb);
    puVar4 = (uv_timer_t *)puVar6;
    if (iVar1 == 0) {
      iVar1 = uv_read_start(puVar9,alloc_cb,read1_cb);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017386d;
    }
  }
  else {
    connect1_cb_cold_1();
    puVar4 = (uv_timer_t *)puVar7;
LAB_00173859:
    connect1_cb_cold_2();
LAB_0017385e:
    connect1_cb_cold_3();
LAB_00173863:
    connect1_cb_cold_4();
  }
  puVar9 = (uv_stream_t *)puVar4;
  connect1_cb_cold_5();
LAB_0017386d:
  connect1_cb_cold_6();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar9,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_open_connected) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  uv_os_sock_t sock;
  uv_buf_t buf = uv_buf_init("PING", 4);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_tcp_socket();

  ASSERT(0 == connect(sock, (struct sockaddr*) &addr,  sizeof(addr)));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &client));

  ASSERT(0 == uv_tcp_open(&client, sock));

  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &client, &buf, 1, write_cb));

  ASSERT(0 == uv_shutdown(&shutdown_req, (uv_stream_t*) &client, shutdown_cb));

  ASSERT(0 == uv_read_start((uv_stream_t*) &client, alloc_cb, read_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(shutdown_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}